

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall spectest::JSONParser::ParseFilename(JSONParser *this,string *out_filename)

{
  string_view filename;
  bool bVar1;
  string local_48;
  Enum local_24;
  string *local_20;
  string *out_filename_local;
  JSONParser *this_local;
  
  local_20 = out_filename;
  out_filename_local = (string *)this;
  local_24 = (Enum)ParseKeyStringValue(this,"filename",out_filename);
  bVar1 = wabt::Failed((Result)local_24);
  if (bVar1) {
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    filename = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
    CreateModulePath_abi_cxx11_(&local_48,this,filename);
    std::__cxx11::string::operator=((string *)local_20,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result JSONParser::ParseFilename(std::string* out_filename) {
  PARSE_KEY_STRING_VALUE("filename", out_filename);
  *out_filename = CreateModulePath(*out_filename);
  return wabt::Result::Ok;
}